

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

bool binary_fuse8_contain(uint64_t key,binary_fuse8_t *filter)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  uint64_t uVar3;
  uint uVar4;
  
  uVar3 = binary_fuse_murmur64(key + filter->Seed);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  auVar2 = ZEXT416(filter->SegmentCountLength) * auVar2;
  uVar4 = filter->SegmentLength + auVar2._8_4_;
  puVar1 = filter->Fingerprints;
  return (byte)(puVar1[(uint)(uVar3 >> 0x12) & filter->SegmentLengthMask ^ uVar4] ^
                puVar1[auVar2._8_8_] ^
               puVar1[filter->SegmentLengthMask & (uint)uVar3 ^ filter->SegmentLength + uVar4]) ==
         (byte)((byte)(uVar3 >> 0x20) ^ (byte)uVar3);
}

Assistant:

static inline bool binary_fuse8_contain(uint64_t key,
                                        const binary_fuse8_t *filter) {
  uint64_t hash = binary_fuse_mix_split(key, filter->Seed);
  uint8_t f = binary_fuse8_fingerprint(hash);
  binary_hashes_t hashes = binary_fuse8_hash_batch(hash, filter);
  f ^= filter->Fingerprints[hashes.h0] ^ filter->Fingerprints[hashes.h1] ^
       filter->Fingerprints[hashes.h2];
  return f == 0;
}